

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

void __thiscall
Assimp::MD5::MD5CameraParser::MD5CameraParser(MD5CameraParser *this,SectionList *mSections)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  CameraFrameList *this_01;
  pointer *ppCVar1;
  pointer *ppuVar2;
  string *psVar3;
  iterator __position;
  pointer pCVar4;
  pointer pEVar5;
  iterator __position_00;
  MD5CameraParser *pMVar6;
  int iVar7;
  Logger *pLVar8;
  ulong uVar9;
  byte *pbVar10;
  char *pcVar11;
  ulong in_RCX;
  char cVar12;
  uint uVar13;
  Element *elem_1;
  pointer pEVar14;
  size_type sVar15;
  pointer pSVar16;
  Element *elem;
  Assimp *pAVar17;
  Assimp *pAVar18;
  CameraAnimFrameDesc local_78;
  pointer local_50;
  pointer local_48;
  MD5CameraParser *local_40;
  pointer local_38;
  
  this_00 = &this->cuts;
  this_01 = &this->frames;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar8 = DefaultLogger::get();
  Logger::debug(pLVar8,"MD5CameraParser begin");
  this->fFrameRate = 24.0;
  pSVar16 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  local_48 = (mSections->
             super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  pMVar6 = this;
  if (pSVar16 != local_48) {
    do {
      local_40 = pMVar6;
      psVar3 = &pSVar16->mName;
      iVar7 = std::__cxx11::string::compare((char *)psVar3);
      local_50 = pSVar16;
      if (iVar7 == 0) {
        pbVar10 = (byte *)(pSVar16->mGlobalValue)._M_dataplus._M_p;
        in_RCX = (ulong)*pbVar10;
        if ((byte)(*pbVar10 - 0x3a) < 0xf6) {
          sVar15 = 0;
        }
        else {
          uVar13 = 0;
          do {
            pbVar10 = pbVar10 + 1;
            uVar13 = (uint)(byte)((char)in_RCX - 0x30) + uVar13 * 10;
            in_RCX = (ulong)*pbVar10;
          } while (0xf5 < (byte)(*pbVar10 - 0x3a));
          sVar15 = (size_type)uVar13;
        }
        std::
        vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
        ::reserve(this_01,sVar15);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)psVar3);
        if (iVar7 == 0) {
          local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ =
               local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
          fast_atoreal_move<float>
                    ((Assimp *)(pSVar16->mGlobalValue)._M_dataplus._M_p,(char *)&local_78,
                     (float *)0x1,SUB81(in_RCX,0));
          this->fFrameRate = local_78.super_BaseFrameDesc.vPositionXYZ.x;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)psVar3);
          if (iVar7 == 0) {
            pbVar10 = (byte *)(pSVar16->mGlobalValue)._M_dataplus._M_p;
            in_RCX = (ulong)*pbVar10;
            if ((byte)(*pbVar10 - 0x3a) < 0xf6) {
              sVar15 = 0;
            }
            else {
              uVar13 = 0;
              do {
                pbVar10 = pbVar10 + 1;
                uVar13 = (uint)(byte)((char)in_RCX - 0x30) + uVar13 * 10;
                in_RCX = (ulong)*pbVar10;
              } while (0xf5 < (byte)(*pbVar10 - 0x3a));
              sVar15 = (size_type)uVar13;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,sVar15);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)psVar3);
            if (iVar7 == 0) {
              pEVar5 = (pSVar16->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pEVar14 = (pSVar16->mElements).
                             super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                             ._M_impl.super__Vector_impl_data._M_start; pEVar14 != pEVar5;
                  pEVar14 = pEVar14 + 1) {
                pcVar11 = pEVar14->szStart;
                cVar12 = *pcVar11;
                in_RCX = 1;
                if (0xf5 < (byte)(cVar12 - 0x3aU)) {
                  iVar7 = 0;
                  do {
                    pcVar11 = pcVar11 + 1;
                    iVar7 = (uint)(byte)(cVar12 - 0x30) + iVar7 * 10;
                    cVar12 = *pcVar11;
                  } while (0xf5 < (byte)(cVar12 - 0x3aU));
                  in_RCX = (ulong)(iVar7 + 1);
                }
                local_78.super_BaseFrameDesc.vPositionXYZ.x = (float)(uint)in_RCX;
                __position_00._M_current =
                     (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>(this_00,__position_00,(uint *)&local_78);
                }
                else {
                  *__position_00._M_current = (uint)in_RCX;
                  ppuVar2 = &(this->cuts).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish;
                  *ppuVar2 = *ppuVar2 + 1;
                }
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)psVar3);
              if (iVar7 == 0) {
                pEVar14 = (local_50->mElements).
                          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_38 = (local_50->mElements).
                           super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                if (pEVar14 != local_38) {
                  do {
                    pAVar18 = (Assimp *)pEVar14->szStart;
                    local_78.super_BaseFrameDesc.vRotationQuat.y = 0.0;
                    local_78.super_BaseFrameDesc.vRotationQuat.z = 0.0;
                    local_78.fFOV = 0.0;
                    local_78.super_BaseFrameDesc.vPositionXYZ.x = 0.0;
                    local_78.super_BaseFrameDesc.vPositionXYZ.y = 0.0;
                    local_78.super_BaseFrameDesc.vPositionXYZ.z = 0.0;
                    local_78.super_BaseFrameDesc.vRotationQuat.x = 0.0;
                    __position._M_current =
                         (this->frames).
                         super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (this->frames).
                        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ::_M_realloc_insert<Assimp::MD5::CameraAnimFrameDesc>
                                (this_01,__position,&local_78);
                    }
                    else {
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vRotationQuat.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vRotationQuat.z
                           = 0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.x = 0.0;
                      ((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.y = 0.0;
                      *(undefined8 *)&((__position._M_current)->super_BaseFrameDesc).vPositionXYZ.z
                           = 0;
                      ppCVar1 = &(this->frames).
                                 super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                      *ppCVar1 = *ppCVar1 + 1;
                    }
                    pCVar4 = (this->frames).
                             super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    pAVar17 = pAVar18;
                    while( true ) {
                      pAVar17 = pAVar17 + 1;
                      uVar9 = (ulong)(byte)*pAVar18;
                      if (0x20 < uVar9) break;
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                      pAVar18 = pAVar18 + 1;
                    }
                    if (*pAVar18 != (Assimp)0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar14->iLineNumber);
                    }
                    for (; uVar9 = (ulong)(byte)*pAVar17, uVar9 < 0x21; pAVar17 = pAVar17 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar18 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar17,(char *)(pCVar4 + -1),(float *)0x1,
                                              SUB81(in_RCX,0)); uVar9 = (ulong)(byte)*pAVar18,
                        uVar9 < 0x21; pAVar18 = pAVar18 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar18 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar18,(char *)&pCVar4[-1].super_BaseFrameDesc.
                                                               vPositionXYZ.y,(float *)0x1,
                                              SUB81(in_RCX,0)); uVar9 = (ulong)(byte)*pAVar18,
                        uVar9 < 0x21; pAVar18 = pAVar18 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    pbVar10 = (byte *)fast_atoreal_move<float>
                                                (pAVar18,(char *)&pCVar4[-1].super_BaseFrameDesc.
                                                                  vPositionXYZ.z,(float *)0x1,
                                                 SUB81(in_RCX,0));
                    pAVar18 = (Assimp *)(pbVar10 + 2);
                    for (; uVar9 = (ulong)*pbVar10, uVar9 < 0x21; pbVar10 = pbVar10 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                      pAVar18 = pAVar18 + 1;
                    }
                    if (*pbVar10 != 0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar14->iLineNumber);
                    }
                    for (; uVar9 = (ulong)(byte)pAVar18[-1], uVar9 < 0x21; pAVar18 = pAVar18 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    if (pAVar18[-1] != (Assimp)0x28) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ( was expected",pEVar14->iLineNumber);
                    }
                    for (; uVar9 = (ulong)(byte)*pAVar18, uVar9 < 0x21; pAVar18 = pAVar18 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar18 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar18,(char *)&pCVar4[-1].super_BaseFrameDesc.
                                                               vRotationQuat,(float *)0x1,
                                              SUB81(in_RCX,0)); uVar9 = (ulong)(byte)*pAVar18,
                        uVar9 < 0x21; pAVar18 = pAVar18 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    for (pAVar18 = (Assimp *)
                                   fast_atoreal_move<float>
                                             (pAVar18,(char *)&pCVar4[-1].super_BaseFrameDesc.
                                                               vRotationQuat.y,(float *)0x1,
                                              SUB81(in_RCX,0)); uVar9 = (ulong)(byte)*pAVar18,
                        uVar9 < 0x21; pAVar18 = pAVar18 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    pAVar17 = (Assimp *)
                              fast_atoreal_move<float>
                                        (pAVar18,(char *)&pCVar4[-1].super_BaseFrameDesc.
                                                          vRotationQuat.z,(float *)0x1,
                                         SUB81(in_RCX,0));
                    pAVar18 = pAVar17;
                    while( true ) {
                      pAVar17 = pAVar17 + 1;
                      uVar9 = (ulong)(byte)*pAVar18;
                      if (0x20 < uVar9) break;
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                      pAVar18 = pAVar18 + 1;
                    }
                    if (*pAVar18 != (Assimp)0x29) {
                      MD5Parser::ReportWarning
                                ("Unexpected token: ) was expected",pEVar14->iLineNumber);
                    }
                    for (; uVar9 = (ulong)(byte)*pAVar17, uVar9 < 0x21; pAVar17 = pAVar17 + 1) {
                      if ((0x100000200U >> (uVar9 & 0x3f) & 1) == 0) {
                        in_RCX = 0x3401;
                        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                          MD5Parser::ReportWarning("Unexpected end of line",pEVar14->iLineNumber);
                        }
                        break;
                      }
                    }
                    local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ =
                         local_78.super_BaseFrameDesc.vPositionXYZ._0_8_ & 0xffffffff00000000;
                    fast_atoreal_move<float>(pAVar17,(char *)&local_78,(float *)0x1,SUB81(in_RCX,0))
                    ;
                    pCVar4[-1].fFOV = local_78.super_BaseFrameDesc.vPositionXYZ.x;
                    pEVar14 = pEVar14 + 1;
                    this = local_40;
                  } while (pEVar14 != local_38);
                }
              }
            }
          }
        }
      }
      pSVar16 = local_50 + 1;
      pMVar6 = local_40;
    } while (pSVar16 != local_48);
  }
  pLVar8 = DefaultLogger::get();
  Logger::debug(pLVar8,"MD5CameraParser end");
  return;
}

Assistant:

MD5CameraParser::MD5CameraParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5CameraParser begin");
    fFrameRate = 24.0f;

    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "numFrames")   {
            frames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "frameRate")  {
            fFrameRate = fast_atof ((*iter).mGlobalValue.c_str());
        }
        else if ((*iter).mName == "numCuts")    {
            cuts.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "cuts")   {
            for (const auto & elem : (*iter).mElements){
                cuts.push_back(strtoul10(elem.szStart)+1);
            }
        }
        else if ((*iter).mName == "camera") {
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                frames.push_back(CameraAnimFrameDesc());
                CameraAnimFrameDesc& cur = frames.back();
                AI_MD5_READ_TRIPLE(cur.vPositionXYZ);
                AI_MD5_READ_TRIPLE(cur.vRotationQuat);
                AI_MD5_SKIP_SPACES();
                cur.fFOV = fast_atof(sz);
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5CameraParser end");
}